

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O3

int coda_cursor_has_ascii_content(coda_cursor *cursor,int *has_ascii_content)

{
  int iVar1;
  coda_type *pcVar2;
  undefined8 uVar3;
  char *message;
  coda_cursor sub_cursor;
  coda_cursor local_320;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar2 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar2 == (coda_type *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar3 = 0x5c0;
  }
  else {
    if (has_ascii_content != (int *)0x0) {
      if (pcVar2->format == coda_backend_ascii) {
        *has_ascii_content = 1;
      }
      else {
        if (99 < pcVar2->format) {
          pcVar2 = *(coda_type **)&pcVar2->type_class;
        }
        if (pcVar2->type_class == 6) {
          memcpy(&local_320,cursor,0x310);
          iVar1 = coda_cursor_use_base_type_of_special_type(&local_320);
          if (iVar1 != 0) {
            return -1;
          }
          iVar1 = coda_cursor_has_ascii_content(&local_320,has_ascii_content);
          return iVar1;
        }
        *has_ascii_content = (uint)(pcVar2->type_class == 4 || pcVar2->format == coda_backend_ascii)
        ;
      }
      return 0;
    }
    message = "has_ascii_content argument is NULL (%s:%u)";
    uVar3 = 0x5c5;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar3);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_has_ascii_content(const coda_cursor *cursor, int *has_ascii_content)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (has_ascii_content == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "has_ascii_content argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            *has_ascii_content = 1;
            break;
        default:
            {
                coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

                if (type->type_class == coda_special_class)
                {
                    coda_cursor sub_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
                    {
                        return -1;
                    }
                    return coda_cursor_has_ascii_content(&sub_cursor, has_ascii_content);
                }
                *has_ascii_content = (type->format == coda_format_ascii || type->type_class == coda_text_class);
            }
            break;
    }
    return 0;
}